

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkExtent2D Diligent::ShadingRateToVkFragmentSize(SHADING_RATE Rate)

{
  VkExtent2D VVar1;
  undefined8 in_RCX;
  byte bVar2;
  SHADING_RATE SVar3;
  string msg;
  
  bVar2 = Rate >> 2 & 3;
  SVar3 = Rate & (SHADING_RATE_1X4|SHADING_RATE_1X2);
  if (SVar3 == (SHADING_RATE_1X4|SHADING_RATE_1X2) || bVar2 == 3) {
    FormatString<char[26],char[96]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Result.width <= (1u << AXIS_SHADING_RATE_MAX) && Result.height <= (1u << AXIS_SHADING_RATE_MAX)"
               ,(char (*) [96])
                CONCAT71((int7)((ulong)in_RCX >> 8),SVar3 != (SHADING_RATE_1X4|SHADING_RATE_1X2)));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ShadingRateToVkFragmentSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x774);
    std::__cxx11::string::~string((string *)&msg);
  }
  VVar1.width = 1 << bVar2;
  VVar1.height = 1 << SVar3;
  return VVar1;
}

Assistant:

VkExtent2D ShadingRateToVkFragmentSize(SHADING_RATE Rate)
{
    VkExtent2D Result;
    Result.width  = 1u << ((Uint32{Rate} >> SHADING_RATE_X_SHIFT) & 0x3);
    Result.height = 1u << (Uint32{Rate} & 0x3);
    VERIFY_EXPR(Result.width > 0 && Result.height > 0);
    VERIFY_EXPR(Result.width <= (1u << AXIS_SHADING_RATE_MAX) && Result.height <= (1u << AXIS_SHADING_RATE_MAX));
    VERIFY_EXPR(IsPowerOfTwo(Result.width) && IsPowerOfTwo(Result.height));
    return Result;
}